

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSetImplement.h
# Opt level: O2

void __thiscall
BitSetImplement<std::bitset<16000UL>,_KDefectiveMADEC>::__init__
          (BitSetImplement<std::bitset<16000UL>,_KDefectiveMADEC> *this,void *P,void *C)

{
  int i;
  size_t __position;
  
  memset(P,0,2000);
  for (__position = 0;
      (long)__position < (long)(this->super_KDefectiveMADEC).super_KDefectiveBase.size;
      __position = __position + 1) {
    std::bitset<16000UL>::set((bitset<16000UL> *)C,__position,true);
  }
  return;
}

Assistant:

void BitSetImplement<Bitset, Base>::__init__(void *P, void *C) {
	Bitset *__P__ = (Bitset*) P, *__C__ = (Bitset*) C;
	__P__ -> reset(); 
	for (int i = 0; i < size; i++) __C__ -> set(i);
}